

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeTupleExtract
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,uint32_t arity,uint32_t index)

{
  TupleExtract *pTVar1;
  bool bVar2;
  Ok local_105;
  uint local_104;
  Err local_100;
  Err *local_e0;
  Err *err;
  ChildPopper local_d0;
  undefined1 local_c8 [8];
  Result<wasm::Ok> _val;
  TupleExtract curr;
  Err local_78;
  allocator<char> local_41;
  Err local_40;
  uint32_t local_20;
  uint32_t local_1c;
  uint32_t index_local;
  uint32_t arity_local;
  IRBuilder *this_local;
  
  local_20 = index;
  local_1c = arity;
  _index_local = this;
  this_local = (IRBuilder *)__return_storage_ptr__;
  if (index < arity) {
    if (arity < 2) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_78,"tuple arity must be at least 2",
                 (allocator<char> *)&curr.field_0x1f);
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_78);
      wasm::Err::~Err(&local_78);
      std::allocator<char>::~allocator((allocator<char> *)&curr.field_0x1f);
    }
    else {
      pTVar1 = (TupleExtract *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
      TupleExtract::TupleExtract(pTVar1);
      ChildPopper::ChildPopper(&local_d0,this);
      std::optional<unsigned_int>::optional<unsigned_int_&,_true>
                ((optional<unsigned_int> *)&err,&local_1c);
      ChildPopper::visitTupleExtract
                ((Result<wasm::Ok> *)local_c8,&local_d0,pTVar1,(optional<unsigned_int>)err);
      local_e0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_c8);
      bVar2 = local_e0 != (Err *)0x0;
      if (bVar2) {
        wasm::Err::Err(&local_100,local_e0);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_100);
        wasm::Err::~Err(&local_100);
      }
      local_104 = (uint)bVar2;
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_c8);
      if (local_104 == 0) {
        pTVar1 = Builder::makeTupleExtract
                           (&this->builder,
                            (Expression *)
                            curr.super_SpecificExpression<(wasm::Expression::Id)58>.super_Expression
                            .type.id,local_20);
        push(this,(Expression *)pTVar1);
        Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_105);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"tuple index out of bounds",&local_41);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_40);
    wasm::Err::~Err(&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeTupleExtract(uint32_t arity, uint32_t index) {
  if (index >= arity) {
    return Err{"tuple index out of bounds"};
  }
  if (arity < 2) {
    return Err{"tuple arity must be at least 2"};
  }
  TupleExtract curr;
  CHECK_ERR(ChildPopper{*this}.visitTupleExtract(&curr, arity));
  push(builder.makeTupleExtract(curr.tuple, index));
  return Ok{};
}